

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint32 ma_rb_available_write(ma_rb *pRB)

{
  int iVar1;
  
  if (pRB != (ma_rb *)0x0) {
    iVar1 = (pRB->encodedWriteOffset & 0x7fffffff) - (pRB->encodedReadOffset & 0x7fffffff);
    if ((int)(pRB->encodedWriteOffset ^ pRB->encodedReadOffset) < 0) {
      iVar1 = iVar1 + pRB->subbufferSizeInBytes;
    }
    return pRB->subbufferSizeInBytes - iVar1;
  }
  return 0;
}

Assistant:

MA_API ma_uint32 ma_rb_available_write(ma_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return (ma_uint32)(ma_rb_get_subbuffer_size(pRB) - ma_rb_pointer_distance(pRB));
}